

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
::cni_holder(cni_holder<bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *this,_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   **func)

{
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_RDI;
  cni_helper<bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *this_00;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffffc0;
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_006c89a8;
  this_00 = (cni_helper<bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<bool(std::__cxx11::string)>::function<bool(*const&)(std::__cxx11::string),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::cni_helper(this_00,in_RDI);
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x4f4f36);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}